

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O2

int check_need_raw_data(void)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  iVar1 = 1;
  if (((need_output == 0) && (need_report == 0)) && (need_identify == 0)) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)num_requests;
    if (num_requests < 1) {
      uVar2 = uVar3;
    }
    for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (lVar4 = 0x10; lVar4 != 0x4c0; lVar4 = lVar4 + 0x18) {
        if ((requests[uVar3] ==
             *(output_data_switch *)((long)&__frame_dummy_init_array_entry + lVar4)) &&
           (*(int *)((long)&matchtable[0].sw + lVar4) != 0)) {
          return 1;
        }
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int check_need_raw_data(void)
{
	int i, j;

	if (need_output || need_report || need_identify) return 1;
	for (i = 0; i < num_requests; i++) {
		for (j = 0; j < sz_match; j++)
			if (requests[i] == matchtable[j].sw &&
			    matchtable[j].ident_required) return 1;
	}
	return 0;
}